

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_patch.c
# Opt level: O0

int json_patch_apply_add_replace
              (json_object **res,json_object *patch_elem,char *path,int add,
              json_patch_error *patch_error)

{
  json_object *obj;
  int iVar1;
  int *piVar2;
  json_type *pjVar3;
  json_object *value_00;
  char *pcVar4;
  json_object *pjStack_40;
  int rc;
  json_object *value;
  json_patch_error *patch_error_local;
  char *pcStack_28;
  int add_local;
  char *path_local;
  json_object *patch_elem_local;
  json_object **res_local;
  
  value = (json_object *)patch_error;
  patch_error_local._4_4_ = add;
  pcStack_28 = path;
  path_local = (char *)patch_elem;
  patch_elem_local = (json_object *)res;
  iVar1 = json_object_object_get_ex(patch_elem,"value",&stack0xffffffffffffffc0);
  if (iVar1 == 0) {
    value->o_type = 0x16;
    value->_pb = (printbuf *)"Patch object does not contain a \'value\' field";
    piVar2 = __errno_location();
    *piVar2 = 0;
    res_local._4_4_ = -1;
  }
  else if ((patch_error_local._4_4_ == 0) &&
          (iVar1 = json_pointer_get(*(json_object **)patch_elem_local,pcStack_28,(json_object **)0x0
                                   ), iVar1 != 0)) {
    pjVar3 = (json_type *)__errno_location();
    value->o_type = *pjVar3;
    piVar2 = __errno_location();
    pcVar4 = "Invalid path field";
    if (*piVar2 == 2) {
      pcVar4 = "Did not find element referenced by path field";
    }
    value->_pb = (printbuf *)pcVar4;
    piVar2 = __errno_location();
    *piVar2 = 0;
    res_local._4_4_ = -1;
  }
  else {
    obj = patch_elem_local;
    pcVar4 = pcStack_28;
    value_00 = json_object_get(pjStack_40);
    res_local._4_4_ =
         json_pointer_set_with_array_cb
                   ((json_object **)obj,pcVar4,value_00,json_object_array_insert_idx_cb,
                    (void *)((long)&patch_error_local + 4));
    if (res_local._4_4_ != 0) {
      pjVar3 = (json_type *)__errno_location();
      value->o_type = *pjVar3;
      value->_pb = (printbuf *)"Failed to set value at path referenced by \'path\' field";
      piVar2 = __errno_location();
      *piVar2 = 0;
      json_object_put(pjStack_40);
    }
  }
  return res_local._4_4_;
}

Assistant:

static int json_patch_apply_add_replace(struct json_object **res,
                                        struct json_object *patch_elem,
                                        const char *path, int add, struct json_patch_error *patch_error)
{
	struct json_object *value;
	int rc;

	if (!json_object_object_get_ex(patch_elem, "value", &value)) {
		_set_err(EINVAL, "Patch object does not contain a 'value' field");
		return -1;
	}
	/* if this is a replace op, then we need to make sure it exists before replacing */
	if (!add && json_pointer_get(*res, path, NULL)) {
		_set_err_from_ptrget(errno, "path");
		return -1;
	}

	rc = json_pointer_set_with_array_cb(res, path, json_object_get(value),
					    json_object_array_insert_idx_cb, &add);
	if (rc)
	{
		_set_err(errno, "Failed to set value at path referenced by 'path' field");
		json_object_put(value);
	}

	return rc;
}